

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_mac_sign_finish(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_size,size_t *mac_length)

{
  psa_status_t pVar1;
  psa_status_t pVar2;
  
  pVar1 = -0x89;
  if (operation->alg != 0) {
    *mac_length = mac_size;
    if (mac_size != 0) {
      memset(mac,0x21,mac_size);
    }
    if ((operation->field_0x4 & 0x10) != 0) {
      pVar1 = psa_mac_finish_internal(operation,mac,mac_size);
      pVar2 = psa_mac_abort(operation);
      if (pVar1 == 0) {
        if (pVar2 == 0) {
          *mac_length = (ulong)operation->mac_size;
          pVar1 = 0;
        }
        else {
          memset(mac,0x21,mac_size);
          pVar1 = pVar2;
        }
      }
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_mac_sign_finish( psa_mac_operation_t *operation,
                                  uint8_t *mac,
                                  size_t mac_size,
                                  size_t *mac_length )
{
    psa_status_t status;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    /* Fill the output buffer with something that isn't a valid mac
     * (barring an attack on the mac and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    *mac_length = mac_size;
    /* If mac_size is 0 then mac may be NULL and then the
     * call to memset would have undefined behavior. */
    if( mac_size != 0 )
        memset( mac, '!', mac_size );

    if( ! operation->is_sign )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_mac_finish_internal( operation, mac, mac_size );

    if( status == PSA_SUCCESS )
    {
        status = psa_mac_abort( operation );
        if( status == PSA_SUCCESS )
            *mac_length = operation->mac_size;
        else
            memset( mac, '!', mac_size );
    }
    else
        psa_mac_abort( operation );
    return( status );
}